

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_equation_units.cpp
# Opt level: O0

int beaufort_beaufortTests_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<beaufort> *this_01;
  TestMetaFactoryBase<std::pair<double,_float>_> *meta_factory;
  allocator local_d9;
  string local_d8;
  CodeLocation local_b8;
  allocator local_89;
  string local_88;
  CodeLocation local_68;
  allocator local_29;
  string local_28;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_28,"beaufort",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
             ,&local_89);
  testing::internal::CodeLocation::CodeLocation(&local_68,&local_88,0x1a9);
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::GetTestSuitePatternHolder<beaufort>
                      (this_00,&local_28,&local_68);
  meta_factory = (TestMetaFactoryBase<std::pair<double,_float>_> *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)0x0;
  testing::internal::TestMetaFactory<beaufort_beaufortTests_Test>::TestMetaFactory
            ((TestMetaFactory<beaufort_beaufortTests_Test> *)meta_factory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
             ,&local_d9);
  testing::internal::CodeLocation::CodeLocation(&local_b8,&local_d8,0x1a9);
  testing::internal::ParameterizedTestSuiteInfo<beaufort>::AddTestPattern
            (this_01,"beaufort","beaufortTests",meta_factory,&local_b8);
  testing::internal::CodeLocation::~CodeLocation(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  testing::internal::CodeLocation::~CodeLocation(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return 0;
}

Assistant:

TEST_P(beaufort, beaufortTests)
{
    auto p = GetParam();
    auto bnumber = p.first;
    auto wspeed = static_cast<double>(p.second);

    auto conv = convert(wspeed, precise::mph, precise::special::beaufort);

    EXPECT_EQ(std::round(conv), std::floor(bnumber));
    EXPECT_NEAR(
        convert(conv, precise::special::beaufort, precise::mph), wspeed, 0.5);
}